

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O3

void av1_free_txb_buf(AV1_COMP *cpi)

{
  aom_free(cpi->coeff_buffer_base);
  cpi->coeff_buffer_base = (CB_COEFF_BUFFER *)0x0;
  aom_free((cpi->coeff_buffer_pool).tcoeff);
  (cpi->coeff_buffer_pool).tcoeff = (tran_low_t *)0x0;
  aom_free((cpi->coeff_buffer_pool).eobs);
  (cpi->coeff_buffer_pool).eobs = (uint16_t *)0x0;
  aom_free((cpi->coeff_buffer_pool).entropy_ctx);
  (cpi->coeff_buffer_pool).entropy_ctx = (uint8_t *)0x0;
  return;
}

Assistant:

void av1_free_txb_buf(AV1_COMP *cpi) {
  CoeffBufferPool *coeff_buf_pool = &cpi->coeff_buffer_pool;
  aom_free(cpi->coeff_buffer_base);
  cpi->coeff_buffer_base = NULL;
  aom_free(coeff_buf_pool->tcoeff);
  coeff_buf_pool->tcoeff = NULL;
  aom_free(coeff_buf_pool->eobs);
  coeff_buf_pool->eobs = NULL;
  aom_free(coeff_buf_pool->entropy_ctx);
  coeff_buf_pool->entropy_ctx = NULL;
}